

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariablePowerGeneralizationImpl.hpp
# Opt level: O1

void __thiscall
Inferences::VariablePowerGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
          *p)

{
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar1;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar2;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar3;
  long lVar4;
  ulong uVar5;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar6;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar7;
  anon_class_16_2_f84bbffd f;
  FlatMeetLattice<int> current;
  Option<Kernel::Variable> var;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> factor;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> summand;
  undefined8 local_b8;
  char local_b0;
  Variable local_ac;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_a8;
  ulong local_a0;
  ulong local_98;
  Preprocess *local_90;
  ulong local_88 [3];
  uint local_70;
  RealConstantType local_60;
  uint local_40;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_38;
  
  local_a8 = p->_ptr;
  pMVar7 = (local_a8->_summands)._stack;
  pMVar1 = (local_a8->_summands)._cursor;
  lVar4 = (long)pMVar1 - (long)pMVar7;
  if (pMVar7 != (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0 && lVar4 != 0) {
    local_a0 = (lVar4 >> 4) * -0x5555555555555555;
    local_98 = (ulong)(pMVar1 != pMVar7);
    local_90 = this;
    do {
      Kernel::RealConstantType::RealConstantType(&local_60,&pMVar7->numeral);
      local_40 = (pMVar7->factors)._id;
      pMVar2 = (pMVar7->factors)._ptr;
      pMVar6 = (pMVar2->_factors)._stack;
      pMVar3 = (pMVar2->_factors)._cursor;
      lVar4 = (long)pMVar3 - (long)pMVar6;
      local_38 = pMVar2;
      if (pMVar6 != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0 && lVar4 != 0)
      {
        uVar5 = (ulong)(pMVar3 != pMVar6);
        do {
          local_88[1] = 0;
          local_88[2] = 0;
          local_88[0] = (ulong)*(byte *)&(pMVar6->term).super_PolyNfSuper._inner.
                                         super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                         .
                                         super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                        & 0xffffffffffffff03;
          f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)pMVar6;
          f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                    *)local_88;
          ::Lib::CoproductImpl::
          RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
          ::
          switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                    ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                      *)local_88,f);
          local_70 = pMVar6->power;
          Kernel::PolyNf::tryVar((PolyNf *)local_88);
          if (local_b0 == '\x01') {
            if (local_70 < 2) {
              local_b8 = 0xff;
            }
            else {
              local_b8 = local_b8 & 0xfffffffffffffffe;
              local_b8._0_5_ = CONCAT41(local_70,(undefined1)local_b8);
            }
            ::Lib::Map<Kernel::Variable,Inferences::FlatMeetLattice<int>,Lib::StlHash>::operator()
                      ((Map<Kernel::Variable,Inferences::FlatMeetLattice<int>,Lib::StlHash> *)
                       local_90->powers,local_ac,(FlatMeetLattice<int> *)&local_b8,
                       (FlatMeetLattice<int> *)&local_b8);
          }
          if (uVar5 < (ulong)((lVar4 >> 2) * 0x6db6db6db6db6db7)) {
            pMVar6 = (pMVar2->_factors)._stack + uVar5;
            uVar5 = uVar5 + 1;
          }
          else {
            pMVar6 = (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
          }
        } while (pMVar6 != (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0);
      }
      mpz_clear(local_60.super_RationalConstantType._den._val);
      mpz_clear((__mpz_struct *)&local_60);
      if (local_98 < local_a0) {
        pMVar7 = (local_a8->_summands)._stack + local_98;
        local_98 = local_98 + 1;
      }
      else {
        pMVar7 = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
      }
    } while (pMVar7 != (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0);
  }
  return;
}

Assistant:

void operator()(Perfect<Polynom<RealTraits>> p) 
  {
    for (auto summand : p->iterSummands()) {
      for (auto factor : summand.factors->iter()) {
        auto var = factor.term.tryVar();
        if (var.isSome()) {


          auto current = factor.power == 0 || factor.power == 1  /* <- power 0 should never happen. 
                                                                       power 1 yields a nop-generalization */
            ? IntLattice::bot()
            : IntLattice(factor.power);

          powers.updateOrInit(var.unwrap(),
              [&](IntLattice old) { return current.meet(old); },
              [&]() { return current; }
            );
        }
      }
    }
  }